

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockmanager_tests.cpp
# Opt level: O2

void __thiscall
blockmanager_tests::blockmanager_scan_unlink_already_pruned_files::test_method
          (blockmanager_scan_unlink_already_pruned_files *this)

{
  BlockManager *this_00;
  ChainstateManager *pCVar1;
  pointer ppCVar2;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar3;
  Chainstate *pCVar4;
  FlatFilePos FVar5;
  CBlockFileInfo *pCVar6;
  iterator pvVar7;
  iterator pvVar8;
  CBlockIndex *pCVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  check_type cVar11;
  CBlockIndex **ppCVar10;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  FlatFilePos new_pos;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  CBlockIndex *new_tip;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  FlatFilePos pos;
  pointer local_138;
  element_type *peStack_130;
  shared_count local_128 [2];
  CBlockIndex *old_tip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  undefined1 local_c8 [24];
  char **local_b0;
  CBlock local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
                      ,0x3b,"test_method","m_node.chainman");
  pCVar1 = (puVar3->_M_t).
           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
           super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&cs_main,"chainman->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
             ,0x3d,false);
  pCVar4 = ChainstateManager::ActiveChainstate
                     ((puVar3->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar4->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar9 = (CBlockIndex *)0x0;
  }
  else {
    pCVar9 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  old_tip = pCVar9;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&cs_main,"chainman->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
             ,0x3e,false);
  FVar5 = CBlockIndex::GetBlockPos(pCVar9);
  this_00 = &pCVar1->m_blockman;
  pCVar6 = ::node::BlockManager::GetBlockFileInfo(this_00,(long)FVar5.nFile);
  pCVar6->nSize = 0x8000000;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  local_138 = (pointer)0x0;
  peStack_130 = (element_type *)0x0;
  local_128[0].pi_ = (sp_counted_base *)0x0;
  CKey::GetPubKey((CPubKey *)&criticalblock14,&(this->super_TestChain100Setup).coinbaseKey);
  GetScriptForRawPubKey((CScript *)local_c8,(CPubKey *)&criticalblock14);
  TestChain100Setup::CreateAndProcessBlock
            (&local_a8,&this->super_TestChain100Setup,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&local_138,
             (CScript *)local_c8,(Chainstate *)0x0);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_a8.vtx);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_c8);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&local_138);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&cs_main,"chainman->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
             ,0x44,false);
  FVar5 = CBlockIndex::GetBlockPos(pCVar9);
  ::node::BlockManager::PruneOneBlockFile(this_00,FVar5.nFile);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  pos.nPos = 0;
  pvVar7 = (iterator)0x4d;
  pvVar8 = (iterator)0x0;
  pos.nFile = FVar5.nFile;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&cs_main,"chainman->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
             ,0x4d,false);
  ::node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar8;
  msg.m_begin = pvVar7;
  file.m_end = (iterator)0x4e;
  file.m_begin = (iterator)&local_150;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_160,msg);
  ::node::BlockManager::OpenBlockFile((AutoFile *)&criticalblock14,this_00,&pos,true);
  peStack_130 = (element_type *)0x0;
  local_128[0].pi_ = (sp_counted_base *)0x0;
  local_b0 = &local_170;
  local_170 = "!blockman.OpenBlockFile(pos, true).IsNull()";
  local_168 = "";
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_178 = "";
  local_138._0_1_ =
       (class_property<bool>)
       (class_property<bool>)(criticalblock14.super_unique_lock._M_device != (mutex_type *)0x0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_138,(lazy_ostream *)local_c8,1,0,WARN,_cVar11,
             (size_t)&local_180,0x4e);
  boost::detail::shared_count::~shared_count(local_128);
  AutoFile::~AutoFile((AutoFile *)&criticalblock14);
  (pCVar1->m_blockman).m_have_pruned = true;
  pvVar7 = (iterator)0x53;
  pvVar8 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&cs_main,"chainman->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
             ,0x53,false);
  ::node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  file_00.m_end = (iterator)0x54;
  file_00.m_begin = (iterator)&local_190;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
             msg_00);
  ::node::BlockManager::OpenBlockFile((AutoFile *)&criticalblock14,this_00,&pos,true);
  local_138._0_1_ =
       (class_property<bool>)(criticalblock14.super_unique_lock._M_device == (mutex_type *)0x0);
  peStack_130 = (element_type *)0x0;
  local_128[0].pi_ = (sp_counted_base *)0x0;
  local_170 = "blockman.OpenBlockFile(pos, true).IsNull()";
  local_168 = "";
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_170;
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_1a8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_138,(lazy_ostream *)local_c8,1,0,WARN,_cVar11,
             (size_t)&local_1b0,0x54);
  boost::detail::shared_count::~shared_count(local_128);
  AutoFile::~AutoFile((AutoFile *)&criticalblock14);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&cs_main,"chainman->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
             ,0x57,false);
  ::node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles(this_00);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  pvVar7 = (iterator)0x5a;
  pvVar8 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&cs_main,"chainman->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
             ,0x5a,false);
  pCVar4 = ChainstateManager::ActiveChainstate
                     ((puVar3->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar2 = (pCVar4->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (pCVar4->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar9 = (CBlockIndex *)0x0;
  }
  else {
    pCVar9 = ppCVar2[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  ppCVar10 = &new_tip;
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  file_01.m_end = (iterator)0x5b;
  file_01.m_begin = (iterator)&local_1c8;
  new_tip = pCVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d8,
             msg_01);
  criticalblock14.super_unique_lock._M_owns = false;
  criticalblock14.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_1e0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::ne_impl,CBlockIndex_const*,CBlockIndex_const*>
            (&criticalblock14,&local_1e8,0x5b,1,3,&old_tip,"old_tip",ppCVar10,"new_tip");
  pvVar7 = (iterator)0x5c;
  pvVar8 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock14,&cs_main,"chainman->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
             ,0x5c,false);
  FVar5 = CBlockIndex::GetBlockPos(new_tip);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
  new_pos.nFile = FVar5.nFile;
  new_pos.nPos = 0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  file_02.m_end = (iterator)0x5e;
  file_02.m_begin = (iterator)&local_200;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_210,
             msg_02);
  ::node::BlockManager::OpenBlockFile((AutoFile *)&criticalblock14,this_00,&new_pos,true);
  local_138 = (pointer)CONCAT71(local_138._1_7_,
                                criticalblock14.super_unique_lock._M_device != (mutex_type *)0x0);
  peStack_130 = (element_type *)0x0;
  local_128[0].pi_ = (sp_counted_base *)0x0;
  local_170 = "!blockman.OpenBlockFile(new_pos, true).IsNull()";
  local_168 = "";
  local_c8[8] = '\0';
  local_c8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_170;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockmanager_tests.cpp"
  ;
  local_218 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_138,(lazy_ostream *)local_c8,1,0,WARN,(check_type)ppCVar10,
             (size_t)&local_220,0x5e);
  boost::detail::shared_count::~shared_count(local_128);
  AutoFile::~AutoFile((AutoFile *)&criticalblock14);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(blockmanager_scan_unlink_already_pruned_files, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    const auto& chainman = Assert(m_node.chainman);
    auto& blockman = chainman->m_blockman;
    const CBlockIndex* old_tip{WITH_LOCK(chainman->GetMutex(), return chainman->ActiveChain().Tip())};
    WITH_LOCK(chainman->GetMutex(), blockman.GetBlockFileInfo(old_tip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));

    // Prune the older block file, but don't unlink it
    int file_number;
    {
        LOCK(chainman->GetMutex());
        file_number = old_tip->GetBlockPos().nFile;
        blockman.PruneOneBlockFile(file_number);
    }

    const FlatFilePos pos(file_number, 0);

    // Check that the file is not unlinked after ScanAndUnlinkAlreadyPrunedFiles
    // if m_have_pruned is not yet set
    WITH_LOCK(chainman->GetMutex(), blockman.ScanAndUnlinkAlreadyPrunedFiles());
    BOOST_CHECK(!blockman.OpenBlockFile(pos, true).IsNull());

    // Check that the file is unlinked after ScanAndUnlinkAlreadyPrunedFiles
    // once m_have_pruned is set
    blockman.m_have_pruned = true;
    WITH_LOCK(chainman->GetMutex(), blockman.ScanAndUnlinkAlreadyPrunedFiles());
    BOOST_CHECK(blockman.OpenBlockFile(pos, true).IsNull());

    // Check that calling with already pruned files doesn't cause an error
    WITH_LOCK(chainman->GetMutex(), blockman.ScanAndUnlinkAlreadyPrunedFiles());

    // Check that the new tip file has not been removed
    const CBlockIndex* new_tip{WITH_LOCK(chainman->GetMutex(), return chainman->ActiveChain().Tip())};
    BOOST_CHECK_NE(old_tip, new_tip);
    const int new_file_number{WITH_LOCK(chainman->GetMutex(), return new_tip->GetBlockPos().nFile)};
    const FlatFilePos new_pos(new_file_number, 0);
    BOOST_CHECK(!blockman.OpenBlockFile(new_pos, true).IsNull());
}